

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnd_p.h
# Opt level: O2

void __thiscall QDragPrivate::QDragPrivate(QDragPrivate *this)

{
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QDragPrivate_00789b68;
  this->source = (QObject *)0x0;
  this->target = (QObject *)0x0;
  this->data = (QMimeData *)0x0;
  QPixmap::QPixmap(&this->pixmap);
  (this->hotspot).xp = 0;
  (this->hotspot).yp = 0;
  (this->supported_actions).super_QFlagsStorageHelper<Qt::DropAction,_4>.
  super_QFlagsStorage<Qt::DropAction>.i = 0;
  (this->customCursors).d.d.ptr =
       (QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>
        *)0x0;
  return;
}

Assistant:

QDragPrivate()
        : source(nullptr)
        , target(nullptr)
        , data(nullptr)
    { }